

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.h
# Opt level: O0

bool glslang::TDefaultIoResolverBase::isTextureType(TType *type)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool local_12;
  bool local_11;
  TType *type_local;
  
  iVar2 = (*type->_vptr_TType[7])();
  local_11 = false;
  if (iVar2 == 0xe) {
    iVar2 = (*type->_vptr_TType[8])();
    bVar1 = TSampler::isTexture((TSampler *)CONCAT44(extraout_var,iVar2));
    local_12 = true;
    if (!bVar1) {
      iVar2 = (*type->_vptr_TType[8])();
      local_12 = TSampler::isSubpass((TSampler *)CONCAT44(extraout_var_00,iVar2));
    }
    local_11 = local_12;
  }
  return local_11;
}

Assistant:

static bool isTextureType(const glslang::TType& type) {
        return (type.getBasicType() == glslang::EbtSampler &&
                (type.getSampler().isTexture() || type.getSampler().isSubpass()));
    }